

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_directory_descriptors(archive_write *a,vdd *vdd)

{
  int iVar1;
  uchar *__dest;
  long *in_RSI;
  archive_write *in_RDI;
  uchar *wb;
  extr_rec *extr;
  int r;
  int depth;
  isoent *np;
  size_t size;
  int iVar2;
  long local_20;
  
  iVar2 = 0;
  local_20 = *in_RSI;
  do {
    iVar1 = _write_directory_descriptors((archive_write *)np,_r,(isoent *)extr,wb._4_4_);
    if (iVar1 < 0) {
      return iVar1;
    }
    if ((int)in_RSI[1] != 1) {
      for (size = *(size_t *)(local_20 + 0xd0); size != 0; size = *(size_t *)(size + 0x808)) {
        __dest = wb_buffptr(in_RDI);
        memcpy(__dest,(void *)(size + 8),(long)*(int *)(size + 4));
        memset(__dest + *(int *)(size + 4),0,(long)(0x800 - *(int *)(size + 4)));
        iVar1 = wb_consume((archive_write *)CONCAT44(iVar2,iVar1),size);
        if (iVar1 < 0) {
          return iVar1;
        }
      }
    }
    if ((*(long *)(local_20 + 0x50) == 0) || ((int)in_RSI[3] <= iVar2 + 1)) {
      for (; local_20 != *(long *)(local_20 + 0x20); local_20 = *(long *)(local_20 + 0x20)) {
        if (*(long *)(local_20 + 0x78) != 0) {
          local_20 = *(long *)(local_20 + 0x78);
          break;
        }
        iVar2 = iVar2 + -1;
      }
    }
    else {
      local_20 = *(long *)(local_20 + 0x50);
      iVar2 = iVar2 + 1;
    }
    if (local_20 == *(long *)(local_20 + 0x20)) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
write_directory_descriptors(struct archive_write *a, struct vdd *vdd)
{
	struct isoent *np;
	int depth, r;

	depth = 0;
	np = vdd->rootent;
	do {
		struct extr_rec *extr;

		r = _write_directory_descriptors(a, vdd, np, depth);
		if (r < 0)
			return (r);
		if (vdd->vdd_type != VDD_JOLIET) {
			/*
			 * This extract record is used by SUSP,RRIP.
			 * Not for joliet.
			 */
			for (extr = np->extr_rec_list.first;
			    extr != NULL;
			    extr = extr->next) {
				unsigned char *wb;

				wb = wb_buffptr(a);
				memcpy(wb, extr->buf, extr->offset);
				memset(wb + extr->offset, 0,
				    LOGICAL_BLOCK_SIZE - extr->offset);
				r = wb_consume(a, LOGICAL_BLOCK_SIZE);
				if (r < 0)
					return (r);
			}
		}

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	return (ARCHIVE_OK);
}